

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O1

char * TadsServerManager::gen_rand_id(void *obj)

{
  tm *data;
  char *pcVar1;
  byte bVar2;
  char cVar3;
  uchar *in_RDI;
  long lVar4;
  long systime;
  time_t timer;
  uchar hval [32];
  sha256_ctx s;
  uchar rbuf [128];
  long local_140;
  time_t local_138;
  uchar *local_130;
  byte local_128 [40];
  sha256_ctx local_100;
  uchar local_98 [128];
  
  local_130 = in_RDI;
  sha256_begin(&local_100);
  lVar4 = 0;
  local_138 = time((time_t *)0x0);
  data = localtime(&local_138);
  sha256_hash((uchar *)data,0x38,&local_100);
  local_140 = os_get_sys_clock_ms();
  sha256_hash((uchar *)&local_140,8,&local_100);
  sha256_hash(local_130,8,&local_100);
  sha256_hash((uchar *)&local_130,8,&local_100);
  os_gen_rand_bytes(local_98,0x80);
  sha256_hash(local_98,0x80,&local_100);
  sha256_end(local_128,&local_100);
  pcVar1 = lib_alloc_str(0x20);
  do {
    bVar2 = local_128[lVar4] & 0xf;
    cVar3 = bVar2 + 0x57;
    if (bVar2 < 10) {
      cVar3 = bVar2 + 0x30;
    }
    pcVar1[lVar4] = cVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  pcVar1[0x20] = '\0';
  return pcVar1;
}

Assistant:

char *TadsServerManager::gen_rand_id(void *obj)
{
    /* set up a hashing buffer */
    sha256_ctx s;
    sha256_begin(&s);

    /* add the current date/time to the hash */
    os_time_t timer = os_time(0);
    struct tm *tblock = os_localtime(&timer);
    sha256_hash((unsigned char *)tblock, sizeof(*tblock), &s);

    /* add the system timer to the hash */
    long systime = os_get_sys_clock_ms();
    sha256_hash((unsigned char *)&systime, sizeof(systime), &s);

    /* add the object address to the hash */
    sha256_hash((unsigned char *)obj, sizeof(obj), &s);

    /* add the current stack location to the hash */
    sha256_hash((unsigned char *)&obj, sizeof(void *), &s);

    /* add some random bytes from the operating system */
    unsigned char rbuf[128];
    os_gen_rand_bytes(rbuf, sizeof(rbuf));
    sha256_hash(rbuf, sizeof(rbuf), &s);

    /* compute the hash */
    unsigned char hval[32];
    sha256_end(hval, &s);

    /* convert it to hex, but just keep the low nybbles, for 32 digits */
    char *ret = lib_alloc_str(32);
    int i;
    for (i = 0 ; i < 32 ; ++i)
        ret[i] = nybble2hex(hval[i]);

    /* null-terminate the string */
    ret[i] = '\0';

    /* return the allocated string */
    return ret;
}